

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeysetTest.h
# Opt level: O1

void SparseKeygenRecurse<Blob<448>,Blob<128>>
               (pfHash hash,int start,int bitsleft,bool inclusive,Blob<448> *k,
               vector<Blob<128>,_std::allocator<Blob<128>_>_> *hashes)

{
  Blob<128> h;
  value_type local_48;
  
  local_48.bytes[0] = '\0';
  local_48.bytes[1] = '\0';
  local_48.bytes[2] = '\0';
  local_48.bytes[3] = '\0';
  local_48.bytes[4] = '\0';
  local_48.bytes[5] = '\0';
  local_48.bytes[6] = '\0';
  local_48.bytes[7] = '\0';
  local_48.bytes[8] = '\0';
  local_48.bytes[9] = '\0';
  local_48.bytes[10] = '\0';
  local_48.bytes[0xb] = '\0';
  local_48.bytes[0xc] = '\0';
  local_48.bytes[0xd] = '\0';
  local_48.bytes[0xe] = '\0';
  local_48.bytes[0xf] = '\0';
  if (start < 0x1c0) {
    do {
      flipbit(k,0x38,start);
      if (bitsleft == 1 || inclusive) {
        (*hash)(k,0x38,0,&local_48);
        std::vector<Blob<128>,_std::allocator<Blob<128>_>_>::push_back(hashes,&local_48);
      }
      if (1 < bitsleft) {
        SparseKeygenRecurse<Blob<448>,Blob<128>>(hash,start + 1,bitsleft + -1,inclusive,k,hashes);
      }
      flipbit(k,0x38,start);
      start = start + 1;
    } while (start != 0x1c0);
  }
  return;
}

Assistant:

void SparseKeygenRecurse ( pfHash hash, int start, int bitsleft, bool inclusive, keytype & k, std::vector<hashtype> & hashes )
{
  const int nbytes = sizeof(keytype);
  const int nbits = nbytes * 8;

  hashtype h;

  for(int i = start; i < nbits; i++)
  {
    flipbit(&k, nbytes, i);

    if(inclusive || (bitsleft == 1))
    {
      hash(&k, sizeof(keytype), 0, &h);
      hashes.push_back(h);
    }

    if(bitsleft > 1)
    {
      SparseKeygenRecurse(hash, i+1, bitsleft-1, inclusive, k, hashes);
    }

    flipbit(&k, nbytes, i);
  }
}